

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__tga_info(stbi__context *s,int *x,int *y,int *comp)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  stbi_uc *psVar5;
  stbi_uc *psVar6;
  byte bVar7;
  uint uVar8;
  stbi_uc *psVar9;
  
  psVar5 = s->img_buffer;
  psVar9 = s->img_buffer_end;
  if (psVar5 < psVar9) {
LAB_00118e25:
    psVar5 = psVar5 + 1;
    s->img_buffer = psVar5;
  }
  else if (s->read_from_callbacks != 0) {
    iVar2 = (*(s->io).read)(s->io_user_data,(char *)s->buffer_start,s->buflen);
    if (iVar2 == 0) {
      s->read_from_callbacks = 0;
      psVar9 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
    }
    else {
      psVar9 = s->buffer_start + iVar2;
    }
    s->img_buffer_end = psVar9;
    psVar5 = s->buffer_start;
    goto LAB_00118e25;
  }
  if (psVar5 < psVar9) {
    psVar6 = psVar5 + 1;
    s->img_buffer = psVar6;
    bVar7 = *psVar5;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_00118ea6;
    psVar5 = s->buffer_start;
    iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
    if (iVar2 == 0) {
      s->read_from_callbacks = 0;
      psVar9 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      bVar7 = 0;
    }
    else {
      psVar9 = psVar5 + iVar2;
      bVar7 = *psVar5;
    }
    s->img_buffer_end = psVar9;
    psVar6 = s->buffer_start + 1;
    s->img_buffer = psVar6;
  }
  psVar5 = psVar6;
  if (1 < bVar7) {
    s->img_buffer = s->img_buffer_original;
    return 0;
  }
LAB_00118ea6:
  if (psVar5 < psVar9) {
    psVar6 = psVar5 + 1;
    s->img_buffer = psVar6;
    bVar7 = *psVar5;
  }
  else {
    if (s->read_from_callbacks == 0) {
      return 0;
    }
    psVar5 = s->buffer_start;
    iVar2 = (*(s->io).read)(s->io_user_data,(char *)psVar5,s->buflen);
    if (iVar2 == 0) {
      s->read_from_callbacks = 0;
      psVar9 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      bVar7 = 0;
    }
    else {
      psVar9 = psVar5 + iVar2;
      bVar7 = *psVar5;
    }
    s->img_buffer_end = psVar9;
    psVar6 = s->buffer_start + 1;
    s->img_buffer = psVar6;
  }
  if (0xfc < (byte)((bVar7 & 0xf7) - 4)) {
    if (((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) ||
       (iVar2 = (int)psVar9 - (int)psVar6, 8 < iVar2)) {
      s->img_buffer = psVar6 + 9;
    }
    else {
      s->img_buffer = psVar9;
      (*(s->io).skip)(s->io_user_data,9 - iVar2);
    }
    iVar2 = stbi__get16le(s);
    if ((iVar2 != 0) && (iVar3 = stbi__get16le(s), iVar3 != 0)) {
      pbVar1 = s->img_buffer;
      if (pbVar1 < s->img_buffer_end) {
        s->img_buffer = pbVar1 + 1;
        uVar8 = (uint)*pbVar1;
      }
      else if (s->read_from_callbacks == 0) {
        uVar8 = 0;
      }
      else {
        psVar9 = s->buffer_start;
        iVar4 = (*(s->io).read)(s->io_user_data,(char *)psVar9,s->buflen);
        if (iVar4 == 0) {
          s->read_from_callbacks = 0;
          psVar5 = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
          uVar8 = 0;
        }
        else {
          psVar5 = psVar9 + iVar4;
          uVar8 = (uint)*psVar9;
        }
        s->img_buffer_end = psVar5;
        s->img_buffer = s->buffer_start + 1;
      }
      if ((byte)((char)uVar8 * ' ' | (byte)((char)uVar8 - 8U) >> 3) < 4) {
        if (x != (int *)0x0) {
          *x = iVar2;
        }
        if (y != (int *)0x0) {
          *y = iVar3;
        }
        if (comp == (int *)0x0) {
          return 1;
        }
        *comp = uVar8 >> 3;
        return 1;
      }
    }
    s->img_buffer = s->img_buffer_original;
  }
  return 0;
}

Assistant:

static int stbi__tga_info(stbi__context *s, int *x, int *y, int *comp)
{
    int tga_w, tga_h, tga_comp;
    int sz;
    stbi__get8(s);                   // discard Offset
    sz = stbi__get8(s);              // color type
    if( sz > 1 ) {
        stbi__rewind(s);
        return 0;      // only RGB or indexed allowed
    }
    sz = stbi__get8(s);              // image type
    // only RGB or grey allowed, +/- RLE
    if ((sz != 1) && (sz != 2) && (sz != 3) && (sz != 9) && (sz != 10) && (sz != 11)) return 0;
    stbi__skip(s,9);
    tga_w = stbi__get16le(s);
    if( tga_w < 1 ) {
        stbi__rewind(s);
        return 0;   // test width
    }
    tga_h = stbi__get16le(s);
    if( tga_h < 1 ) {
        stbi__rewind(s);
        return 0;   // test height
    }
    sz = stbi__get8(s);               // bits per pixel
    // only RGB or RGBA or grey allowed
    if ((sz != 8) && (sz != 16) && (sz != 24) && (sz != 32)) {
        stbi__rewind(s);
        return 0;
    }
    tga_comp = sz;
    if (x) *x = tga_w;
    if (y) *y = tga_h;
    if (comp) *comp = tga_comp / 8;
    return 1;                   // seems to have passed everything
}